

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

double __thiscall ON_SubDEdge::EndSharpness(ON_SubDEdge *this,ON_SubDVertex *v)

{
  double dVar1;
  
  if (v != (ON_SubDVertex *)0x0) {
    if (this->m_vertex[0] == v) {
      dVar1 = EndSharpness(this,0);
      return dVar1;
    }
    if (this->m_vertex[1] == v) {
      dVar1 = EndSharpness(this,1);
      return dVar1;
    }
  }
  return 0.0;
}

Assistant:

double ON_SubDEdge::EndSharpness(
  const ON_SubDVertex* v
) const
{
  if (nullptr != v)
  {
    if (v == m_vertex[0])
      return EndSharpness(0U);
    if (v == m_vertex[1])
      return EndSharpness(1U);
  }
  return 0.0;
}